

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::build_function_control_flow_graphs_and_analyze(Compiler *this)

{
  TypedID<(diligent_spirv_cross::Types)6> *pTVar1;
  int iVar2;
  CFG *__ptr;
  size_t sVar3;
  uint *puVar4;
  Variant *pVVar5;
  default_delete<diligent_spirv_cross::CFG> *this_00;
  CFG *this_01;
  SPIRFunction *pSVar6;
  SPIRBlock *pSVar7;
  Bitset *pBVar8;
  SPIRVariable *pSVar9;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar10;
  Bitset *pBVar11;
  const_iterator cVar12;
  SPIRType *pSVar13;
  ulong uVar14;
  SPIRConstant *pSVar15;
  _Hash_node_base *p_Var16;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar17;
  long lVar18;
  __node_base *p_Var19;
  TypedID<(diligent_spirv_cross::Types)6> *pTVar20;
  CFGBuilder handler;
  AnalyzeVariableScopeAccessHandler scope_handler;
  OpcodeHandler local_220;
  Compiler *local_218;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_210;
  AnalyzeVariableScopeAccessHandler local_1d8;
  
  local_220._vptr_OpcodeHandler = (_func_int **)&PTR__CFGBuilder_00922488;
  local_210._M_buckets = &local_210._M_single_bucket;
  local_210._M_bucket_count = 1;
  local_210._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_210._M_element_count = 0;
  local_210._M_rehash_policy._M_max_load_factor = 1.0;
  local_210._M_rehash_policy._M_next_resize = 0;
  local_210._M_single_bucket = (__node_base_ptr)0x0;
  local_1d8.super_OpcodeHandler._vptr_OpcodeHandler._0_4_ = (this->ir).default_entry_point.id;
  local_218 = this;
  this_00 = (default_delete<diligent_spirv_cross::CFG> *)
            ::std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&local_210,(key_type *)&local_1d8);
  this_01 = (CFG *)operator_new(0x168);
  pSVar6 = Variant::get<diligent_spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  CFG::CFG(this_01,this,pSVar6);
  __ptr = *(CFG **)this_00;
  *(CFG **)this_00 = this_01;
  if (__ptr != (CFG *)0x0) {
    ::std::default_delete<diligent_spirv_cross::CFG>::operator()(this_00,__ptr);
  }
  pSVar6 = Variant::get<diligent_spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar6,&local_220);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->function_cfgs)._M_h,&local_210);
  p_Var16 = (this->function_cfgs)._M_h._M_before_begin._M_nxt;
  uVar14 = (this->function_cfgs)._M_h._M_element_count;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    do {
      pSVar6 = Variant::get<diligent_spirv_cross::SPIRFunction>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)&p_Var16[1]._M_nxt);
      local_1d8.super_OpcodeHandler._vptr_OpcodeHandler =
           (_func_int **)&PTR__AnalyzeVariableScopeAccessHandler_009223d8;
      local_1d8.accessed_variables_to_block._M_h._M_buckets =
           &local_1d8.accessed_variables_to_block._M_h._M_single_bucket;
      local_1d8.accessed_variables_to_block._M_h._M_bucket_count = 1;
      local_1d8.accessed_variables_to_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1d8.accessed_variables_to_block._M_h._M_element_count = 0;
      local_1d8.accessed_variables_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.accessed_variables_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.accessed_variables_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.accessed_temporaries_to_block._M_h._M_buckets =
           &local_1d8.accessed_temporaries_to_block._M_h._M_single_bucket;
      local_1d8.accessed_temporaries_to_block._M_h._M_bucket_count = 1;
      local_1d8.accessed_temporaries_to_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1d8.accessed_temporaries_to_block._M_h._M_element_count = 0;
      local_1d8.accessed_temporaries_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.accessed_temporaries_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.accessed_temporaries_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.result_id_to_type._M_h._M_buckets =
           &local_1d8.result_id_to_type._M_h._M_single_bucket;
      local_1d8.result_id_to_type._M_h._M_bucket_count = 1;
      local_1d8.result_id_to_type._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1d8.result_id_to_type._M_h._M_element_count = 0;
      local_1d8.result_id_to_type._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.result_id_to_type._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.result_id_to_type._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.complete_write_variables_to_block._M_h._M_buckets =
           &local_1d8.complete_write_variables_to_block._M_h._M_single_bucket;
      local_1d8.complete_write_variables_to_block._M_h._M_bucket_count = 1;
      local_1d8.complete_write_variables_to_block._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      local_1d8.complete_write_variables_to_block._M_h._M_element_count = 0;
      local_1d8.complete_write_variables_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.complete_write_variables_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.complete_write_variables_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.partial_write_variables_to_block._M_h._M_buckets =
           &local_1d8.partial_write_variables_to_block._M_h._M_single_bucket;
      local_1d8.partial_write_variables_to_block._M_h._M_bucket_count = 1;
      local_1d8.partial_write_variables_to_block._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      local_1d8.partial_write_variables_to_block._M_h._M_element_count = 0;
      local_1d8.partial_write_variables_to_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.partial_write_variables_to_block._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.partial_write_variables_to_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.access_chain_expressions._M_h._M_buckets =
           &local_1d8.access_chain_expressions._M_h._M_single_bucket;
      local_1d8.access_chain_expressions._M_h._M_bucket_count = 1;
      local_1d8.access_chain_expressions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1d8.access_chain_expressions._M_h._M_element_count = 0;
      local_1d8.access_chain_expressions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.access_chain_expressions._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.access_chain_expressions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.rvalue_forward_children._M_h._M_buckets =
           &local_1d8.rvalue_forward_children._M_h._M_single_bucket;
      local_1d8.rvalue_forward_children._M_h._M_bucket_count = 1;
      local_1d8.rvalue_forward_children._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1d8.rvalue_forward_children._M_h._M_element_count = 0;
      local_1d8.rvalue_forward_children._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_1d8.rvalue_forward_children._M_h._M_rehash_policy._M_next_resize = 0;
      local_1d8.rvalue_forward_children._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1d8.current_block = (SPIRBlock *)0x0;
      local_1d8.compiler = this;
      local_1d8.entry = pSVar6;
      analyze_variable_scope(this,pSVar6,&local_1d8);
      find_function_local_luts(this,pSVar6,&local_1d8,uVar14 < 2);
      sVar3 = (pSVar6->blocks).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.
              buffer_size;
      if (sVar3 != 0) {
        pTVar20 = (pSVar6->blocks).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.
                  ptr;
        pTVar1 = pTVar20 + sVar3;
        do {
          pSVar7 = Variant::get<diligent_spirv_cross::SPIRBlock>
                             ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              pTVar20->id);
          if (1 < (pSVar7->loop_variables).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                  buffer_size) {
            pBVar8 = ParsedIR::get_decoration_bitset
                               (&this->ir,
                                (ID)((pSVar7->loop_variables).
                                     super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                    .ptr)->id);
            pSVar9 = Variant::get<diligent_spirv_cross::SPIRVariable>
                               ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                ((pSVar7->loop_variables).
                                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                .ptr)->id);
            sVar3 = (pSVar7->loop_variables).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                    .buffer_size;
            if (sVar3 != 0) {
              iVar2 = *(int *)&(pSVar9->super_IVariant).field_0xc;
              pTVar17 = (pSVar7->loop_variables).
                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                        .ptr;
              pTVar10 = pTVar17 + sVar3;
              do {
                pBVar11 = ParsedIR::get_decoration_bitset(&this->ir,(ID)pTVar17->id);
                if ((pBVar8->lower != pBVar11->lower) ||
                   ((pBVar8->higher)._M_h._M_element_count !=
                    (pBVar11->higher)._M_h._M_element_count)) {
LAB_00330409:
                  sVar3 = (pSVar7->loop_variables).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                          .buffer_size;
                  if (sVar3 != 0) {
                    pTVar17 = (pSVar7->loop_variables).
                              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                              .ptr;
                    lVar18 = 0;
                    do {
                      pSVar9 = Variant::get<diligent_spirv_cross::SPIRVariable>
                                         ((this->ir).ids.
                                          super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                          *(uint *)((long)&pTVar17->id + lVar18));
                      pSVar9->loop_variable = false;
                      lVar18 = lVar18 + 4;
                    } while (sVar3 << 2 != lVar18);
                  }
                  (pSVar7->loop_variables).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.
                  buffer_size = 0;
                  break;
                }
                p_Var19 = &(pBVar8->higher)._M_h._M_before_begin;
                while (p_Var19 = p_Var19->_M_nxt, p_Var19 != (__node_base *)0x0) {
                  cVar12 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&(pBVar11->higher)._M_h,(key_type *)(p_Var19 + 1));
                  if (cVar12.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                      (__node_type *)0x0) goto LAB_00330409;
                }
                pSVar9 = Variant::get<diligent_spirv_cross::SPIRVariable>
                                   ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                                    ptr + ((pSVar7->loop_variables).
                                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                          .ptr)->id);
                if (iVar2 != *(int *)&(pSVar9->super_IVariant).field_0xc) goto LAB_00330409;
                pTVar17 = pTVar17 + 1;
              } while (pTVar17 != pTVar10);
            }
          }
          pTVar20 = pTVar20 + 1;
        } while (pTVar20 != pTVar1);
      }
      local_1d8.super_OpcodeHandler._vptr_OpcodeHandler =
           (_func_int **)&PTR__AnalyzeVariableScopeAccessHandler_009223d8;
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1d8.rvalue_forward_children._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_1d8.access_chain_expressions._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1d8.partial_write_variables_to_block._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1d8.complete_write_variables_to_block._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1d8.result_id_to_type._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1d8.accessed_temporaries_to_block._M_h);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1d8.accessed_variables_to_block._M_h);
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  if ((1 < uVar14) &&
     (sVar3 = (this->global_variables).super_VectorView<unsigned_int>.buffer_size, sVar3 != 0)) {
    puVar4 = (this->global_variables).super_VectorView<unsigned_int>.ptr;
    lVar18 = 0;
    do {
      pSVar9 = Variant::get<diligent_spirv_cross::SPIRVariable>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          *(uint *)((long)puVar4 + lVar18));
      pSVar13 = get_variable_data_type(this,pSVar9);
      if (((((*(uint *)&(pSVar13->super_IVariant).field_0xc & 0xfffffffe) == 0x1c) &&
           (pSVar9->storage == Private)) && (uVar14 = (ulong)(pSVar9->initializer).id, uVar14 != 0))
         && ((pSVar9->is_written_to == false &&
             (pVVar5 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
             pVVar5[uVar14].type == TypeConstant)))) {
        pSVar15 = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar5 + uVar14);
        pSVar15->is_used_as_lut = true;
        (pSVar9->static_expression).id = (pSVar9->initializer).id;
        pSVar9->statically_assigned = true;
        pSVar9->remapped_variable = true;
      }
      lVar18 = lVar18 + 4;
    } while (sVar3 << 2 != lVar18);
  }
  local_220._vptr_OpcodeHandler = (_func_int **)&PTR__CFGBuilder_00922488;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_210);
  return;
}

Assistant:

Compiler::CFGBuilder::CFGBuilder(Compiler &compiler_)
    : compiler(compiler_)
{
}